

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumDescriptorProto::InternalSwap
          (EnumDescriptorProto *this,EnumDescriptorProto *other)

{
  uint32 uVar1;
  void *pvVar2;
  string *psVar3;
  EnumOptions *pEVar4;
  UnknownFieldSet *other_00;
  
  pvVar2 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar2 & 1) == 0) goto LAB_002b8405;
LAB_002b83f8:
    other_00 = (UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar2 & 1) != 0) goto LAB_002b83f8;
    other_00 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00);
LAB_002b8405:
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->value_).super_RepeatedPtrFieldBase,&(other->value_).super_RepeatedPtrFieldBase)
  ;
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->reserved_range_).super_RepeatedPtrFieldBase,
             &(other->reserved_range_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->reserved_name_).super_RepeatedPtrFieldBase,
             &(other->reserved_name_).super_RepeatedPtrFieldBase);
  psVar3 = (this->name_).ptr_;
  (this->name_).ptr_ = (other->name_).ptr_;
  (other->name_).ptr_ = psVar3;
  pEVar4 = this->options_;
  this->options_ = other->options_;
  other->options_ = pEVar4;
  return;
}

Assistant:

void EnumDescriptorProto::InternalSwap(EnumDescriptorProto* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  value_.InternalSwap(&other->value_);
  reserved_range_.InternalSwap(&other->reserved_range_);
  reserved_name_.InternalSwap(&other->reserved_name_);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(options_, other->options_);
}